

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O0

_Bool do_cmd_open_chest(loc_conflict grid,object *obj)

{
  _Bool _Var1;
  uint32_t uVar2;
  _Bool local_23;
  byte local_22;
  byte local_21;
  int local_20;
  _Bool scatter;
  _Bool more;
  wchar_t wStack_1c;
  _Bool flag;
  wchar_t j;
  wchar_t i;
  object *obj_local;
  loc_conflict grid_local;
  
  local_21 = 1;
  local_22 = 0;
  _j = obj;
  obj_local = (object *)grid;
  if (0 < obj->pval) {
    local_21 = 0;
    wStack_1c = (player->state).skills[0];
    if ((player->timed[2] != 0) || (_Var1 = no_light(player), _Var1)) {
      wStack_1c = wStack_1c / 10;
    }
    if ((player->timed[4] != 0) || (player->timed[6] != 0)) {
      wStack_1c = wStack_1c / 10;
    }
    local_20 = wStack_1c - _j->pval;
    if (local_20 < 2) {
      local_20 = 2;
    }
    uVar2 = Rand_div(100);
    if ((int)uVar2 < local_20) {
      msgt(0x57,"You have picked the lock.");
      player_exp_gain(player,1);
      local_21 = 1;
    }
    else {
      local_22 = 1;
      event_signal(EVENT_INPUT_FLUSH);
      msgt(0x1c,"You failed to pick the lock.");
    }
  }
  if ((local_21 & 1) != 0) {
    local_23 = false;
    _Var1 = player_is_trapsafe(player);
    if (_Var1) {
      if ((0 < _j->pval) && (_Var1 = player_of_has(player,L'('), _Var1)) {
        equip_learn_flag(player,L'(');
      }
    }
    else {
      chest_trap(_j,&local_23);
    }
    chest_death((loc_conflict)obj_local,_j,(_Bool)(local_23 & 1));
    player->upkeep->notice = player->upkeep->notice | 2;
  }
  if (_j->pval == 0) {
    _j->known->notice = _j->known->notice | 4;
  }
  square_light_spot((chunk *)cave,(loc)obj_local);
  return (_Bool)(local_22 & 1);
}

Assistant:

bool do_cmd_open_chest(struct loc grid, struct object *obj)
{
	int i, j;

	bool flag = true;

	bool more = false;

	/* Attempt to unlock it */
	if (obj->pval > 0) {
		/* Assume locked, and thus not open */
		flag = false;

		/* Get the "disarm" factor */
		i = player->state.skills[SKILL_DISARM_PHYS];

		/* Penalize some conditions */
		if (player->timed[TMD_BLIND] || no_light(player)) i = i / 10;
		if (player->timed[TMD_CONFUSED] || player->timed[TMD_IMAGE]) i = i / 10;

		/* Extract the difficulty */
		j = i - obj->pval;

		/* Always have a small chance of success */
		if (j < 2) j = 2;

		/* Success -- May still have traps */
		if (randint0(100) < j) {
			msgt(MSG_LOCKPICK, "You have picked the lock.");
			player_exp_gain(player, 1);
			flag = true;
		} else {
			/* We may continue repeating */
			more = true;
			event_signal(EVENT_INPUT_FLUSH);
			msgt(MSG_LOCKPICK_FAIL, "You failed to pick the lock.");
		}
	}

	/* Allowed to open */
	if (flag) {
		bool scatter = false;

		/* Apply chest traps, if any and player is not trapsafe */
		if (!player_is_trapsafe(player)) {
			chest_trap(obj, &scatter);
		} else if ((obj->pval > 0) && player_of_has(player, OF_TRAP_IMMUNE)) {
			/* Learn trap immunity if there are traps */
			equip_learn_flag(player, OF_TRAP_IMMUNE);
		}

		/* Let the Chest drop items */
		chest_death(grid, obj, scatter);

		/* Ignore chest if autoignore calls for it */
		player->upkeep->notice |= PN_IGNORE;
	}

	/* Empty chests were always ignored in ignore_item_okay so we
	 * might as well ignore it here
	 */
	if (obj->pval == 0)
		obj->known->notice |= OBJ_NOTICE_IGNORE;

	/* Redraw chest, to be on the safe side (it may have been ignored) */
	square_light_spot(cave, grid);

	/* Result */
	return (more);
}